

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# third_worker.h
# Opt level: O0

void __thiscall chain_of_responsibility::ThirdWorker::ThirdWorker(ThirdWorker *this)

{
  ThirdWorker *this_local;
  
  IWorker::IWorker(&this->super_IWorker);
  (this->super_IWorker)._vptr_IWorker = (_func_int **)&PTR_HandlerRequest_0019e998;
  std::__cxx11::string::operator=((string *)&(this->super_IWorker).name_,"third worker");
  return;
}

Assistant:

ThirdWorker::ThirdWorker(/* args */) {
    name_ = "third worker";
}